

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O2

void pair1_pipe_send_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x10);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    m = nni_aio_get_msg(aio);
    nni_msg_free(m);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
    return;
  }
  pair1_send_sched(*(pair1_sock **)((long)arg + 8));
  return;
}

Assistant:

static void
pair1_pipe_send_cb(void *arg)
{
	pair1_pipe *p = arg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	pair1_send_sched(p->pair);
}